

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlUpdateTexture(uint id,int offsetX,int offsetY,int width,int height,int format,void *data)

{
  uint glType;
  uint glFormat;
  uint glInternalFormat;
  
  (*glad_glBindTexture)(0xde1,id);
  rlGetGlTextureFormats(format,&glInternalFormat,&glFormat,&glType);
  if ((format < 0xe) && (glInternalFormat != 0)) {
    (*glad_glTexSubImage2D)(0xde1,0,offsetX,offsetY,width,height,glFormat,glType,data);
    return;
  }
  TraceLog(4,"TEXTURE: [ID %i] Failed to update for current texture format (%i)",(ulong)id,format);
  return;
}

Assistant:

void rlUpdateTexture(unsigned int id, int offsetX, int offsetY, int width, int height, int format, const void *data)
{
    glBindTexture(GL_TEXTURE_2D, id);

    unsigned int glInternalFormat, glFormat, glType;
    rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

    if ((glInternalFormat != 0) && (format < RL_PIXELFORMAT_COMPRESSED_DXT1_RGB))
    {
        glTexSubImage2D(GL_TEXTURE_2D, 0, offsetX, offsetY, width, height, glFormat, glType, data);
    }
    else TRACELOG(RL_LOG_WARNING, "TEXTURE: [ID %i] Failed to update for current texture format (%i)", id, format);
}